

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arith.cpp
# Opt level: O0

void __thiscall DragonParser::InterNamespace::Arith::Arith(Arith *this,Token *tkn,Expr *x1,Expr *x2)

{
  Type *t;
  Expr *x2_local;
  Expr *x1_local;
  Token *tkn_local;
  Arith *this_local;
  
  t = SymbolNamespace::Type::max(&x1->type,&x2->type);
  Op::Op(&this->super_Op,tkn,t);
  (this->super_Op).super_Expr._vptr_Expr = (_func_int **)&PTR_gen_00110ce8;
  Expr::Expr(&this->expr1);
  Expr::Expr(&this->expr2);
  Expr::operator=(&this->expr1,x1);
  Expr::operator=(&this->expr2,x2);
  return;
}

Assistant:

Arith::Arith(Token &tkn, Expr &x1, Expr &x2) :
            Op(tkn, const_cast<Type&>(*(Type::max(x1.type, x2.type)))) {
        expr1 = x1;
        expr2 = x2;
    }